

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Neuron.cpp
# Opt level: O3

void __thiscall Neuron::watchFor(Neuron *this,vector<Neuron_*,_std::allocator<Neuron_*>_> *v)

{
  __normal_iterator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_*,_std::vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>_>
  _Var1;
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::vector<Neuron*,std::allocator<Neuron*>>*,std::vector<std::vector<Neuron*,std::allocator<Neuron*>>,std::allocator<std::vector<Neuron*,std::allocator<Neuron*>>>>>,__gnu_cxx::__ops::_Iter_equals_val<std::vector<Neuron*,std::allocator<Neuron*>>const>>
                    ((this->m_watchFor).
                     super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->m_watchFor).
                     super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,v);
  if ((_Var1._M_current ==
       (this->m_watchFor).
       super__Vector_base<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((v->super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>)._M_impl.super__Vector_impl_data.
      _M_start !=
      (v->super__Vector_base<Neuron_*,_std::allocator<Neuron_*>_>)._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::
    vector<std::vector<Neuron_*,_std::allocator<Neuron_*>_>,_std::allocator<std::vector<Neuron_*,_std::allocator<Neuron_*>_>_>_>
    ::push_back(&this->m_watchFor,v);
    return;
  }
  return;
}

Assistant:

void Neuron::watchFor(std::vector<Neuron*>& v)
{
    if (std::find(m_watchFor.begin(), m_watchFor.end(), v) != m_watchFor.end() || v.empty())
        return;

    m_watchFor.push_back(v);
}